

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  _Rb_tree_header *p_Var1;
  pointer file;
  bool bVar2;
  uint uVar3;
  Symbol SVar4;
  DescriptorBuilder *pDVar5;
  Symbol SVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  DescriptorBuilder *this_00;
  DescriptorBuilder *pDVar9;
  FileDescriptor *pFVar10;
  
  this_00 = this;
  SVar4 = FindSymbolNotEnforcingDeps(this,name,build_it);
  if (SVar4.ptr_ == (SymbolBase *)0x0) {
    return (Symbol)(SymbolBase *)0x0;
  }
  if ((SVar4.ptr_)->symbol_type_ == 0) {
    return (Symbol)SVar4.ptr_;
  }
  if (this->pool_->enforce_dependencies_ != true) {
    return (Symbol)SVar4.ptr_;
  }
  pFVar10 = (FileDescriptor *)0x0;
  uVar3 = (uint)(SVar4.ptr_)->symbol_type_;
  if (uVar3 < 10) {
    SVar6 = SVar4;
    if ((0x296U >> (uVar3 & 0x1f) & 1) == 0) {
      if ((0x128U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_00350b23;
      SVar6.ptr_ = *(SymbolBase **)(SVar4.ptr_ + 0x10);
    }
    pFVar10 = *(FileDescriptor **)(SVar6.ptr_ + 0x10);
  }
LAB_00350b23:
  if (pFVar10 != this->file_) {
    p_Var7 = (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    if (p_Var7 != (_Base_ptr)0x0) {
      do {
        this_00 = (DescriptorBuilder *)(ulong)(*(FileDescriptor **)(p_Var7 + 1) < pFVar10);
        if (*(FileDescriptor **)(p_Var7 + 1) >= pFVar10) {
          p_Var8 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[(long)this_00];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var8 != p_Var1) && (*(FileDescriptor **)(p_Var8 + 1) <= pFVar10)) {
        return (Symbol)SVar4.ptr_;
      }
    }
    if (uVar3 == 9) {
      bVar2 = IsInPackage(this_00,this->file_,name);
      if (bVar2) {
        return (Symbol)SVar4.ptr_;
      }
      pDVar5 = (DescriptorBuilder *)
               (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (pDVar9 = pDVar5, pDVar9 != (DescriptorBuilder *)p_Var1) {
        file = (pDVar9->options_to_interpret_).
               super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        if ((file != (pointer)0x0) &&
           (bVar2 = IsInPackage(this_00,(FileDescriptor *)file,name), bVar2)) {
          return (Symbol)SVar4.ptr_;
        }
        pDVar5 = (DescriptorBuilder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar9);
        this_00 = pDVar9;
      }
    }
    this->possible_undeclared_dependency_ = pFVar10;
    std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
    SVar4.ptr_ = (anonymous_namespace)::kNullSymbol;
  }
  return (Symbol)SVar4.ptr_;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const std::string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    return result;
  }

  if (result.type() == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be nullptr if it was not found or had errors.
      if (*it != nullptr && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}